

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:220:23)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:220:23)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<capnp::MessageReaderAndFds> *pEVar1;
  Maybe<unsigned_long> *t;
  Type *func;
  MessageReaderAndFds local_598;
  ExceptionOr<capnp::MessageReaderAndFds> local_578;
  Maybe<unsigned_long> *local_3b8;
  Maybe<unsigned_long> *depValue;
  Maybe<unsigned_long> *_depValue779;
  Exception *local_1e8;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1c8 [8];
  ExceptionOr<kj::Maybe<unsigned_long>_> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<kj::Maybe<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:220:23)>
  *this_local;
  
  depResult.value.ptr.field_1.value.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)output;
  ExceptionOr<kj::Maybe<unsigned_long>_>::ExceptionOr
            ((ExceptionOr<kj::Maybe<unsigned_long>_> *)local_1c8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1c8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c8);
  if (depException == (Exception *)0x0) {
    t = readMaybe<kj::Maybe<unsigned_long>>
                  ((Maybe<kj::Maybe<unsigned_long>_> *)
                   ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.
                           builder + 0x18));
    depValue = t;
    if (t != (Maybe<unsigned_long> *)0x0) {
      local_3b8 = t;
      func = (Type *)mv<kj::Maybe<unsigned_long>>(t);
      MaybeVoidCaller<kj::Maybe<unsigned_long>,capnp::MessageReaderAndFds>::
      apply<capnp::readMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>
                (&local_598,
                 (MaybeVoidCaller<kj::Maybe<unsigned_long>,capnp::MessageReaderAndFds> *)&this->func
                 ,func,t);
      TransformPromiseNodeBase::handle<capnp::MessageReaderAndFds>
                (&local_578,&this->super_TransformPromiseNodeBase,&local_598);
      pEVar1 = ExceptionOrValue::as<capnp::MessageReaderAndFds>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.ptr.field_1);
      ExceptionOr<capnp::MessageReaderAndFds>::operator=(pEVar1,&local_578);
      ExceptionOr<capnp::MessageReaderAndFds>::~ExceptionOr(&local_578);
      ::capnp::MessageReaderAndFds::~MessageReaderAndFds(&local_598);
    }
  }
  else {
    local_1e8 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<capnp::MessageReaderAndFds>::ExceptionOr
              ((ExceptionOr<capnp::MessageReaderAndFds> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<capnp::MessageReaderAndFds>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.ptr.field_1);
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              (pEVar1,(ExceptionOr<capnp::MessageReaderAndFds> *)&_depValue779);
    ExceptionOr<capnp::MessageReaderAndFds>::~ExceptionOr
              ((ExceptionOr<capnp::MessageReaderAndFds> *)&_depValue779);
  }
  ExceptionOr<kj::Maybe<unsigned_long>_>::~ExceptionOr
            ((ExceptionOr<kj::Maybe<unsigned_long>_> *)local_1c8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }